

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcSymLocal * __thiscall
CTcPrsSymtab::add_local
          (CTcPrsSymtab *this,textchar_t *sym,size_t len,int local_num,int copy_str,
          int init_assigned,int init_referenced)

{
  int iVar1;
  undefined4 extraout_var;
  CTcSymLocal *pCVar2;
  ulong in_RDX;
  undefined8 in_RSI;
  CTcSymLocalBase *in_RDI;
  int in_R9D;
  int in_stack_00000008;
  CTcSymLocal *lcl;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  size_t in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  CTcSymLocal *local_8;
  
  iVar1 = (*(in_RDI->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
            _vptr_CVmHashEntry[2])(in_RDI,in_RSI,in_RDX);
  if (CONCAT44(extraout_var,iVar1) == 0) {
    pCVar2 = (CTcSymLocal *)CTcSymbolBase::operator_new(0x25ba25);
    CTcSymLocal::CTcSymLocal
              ((CTcSymLocal *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8,
               in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
               (int)((ulong)in_RDI >> 0x20));
    local_8 = pCVar2;
    if (in_R9D != 0) {
      CTcSymLocalBase::set_val_assigned(in_RDI,(int)((ulong)pCVar2 >> 0x20));
    }
    if (in_stack_00000008 != 0) {
      CTcSymLocalBase::set_val_used(in_RDI,(int)((ulong)pCVar2 >> 0x20));
    }
    (*(in_RDI->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
      _vptr_CVmHashEntry[3])(in_RDI,local_8);
  }
  else {
    CTcTokenizer::log_error(0x2b37,in_RDX & 0xffffffff,in_RSI);
    local_8 = (CTcSymLocal *)0x0;
  }
  return local_8;
}

Assistant:

CTcSymLocal *CTcPrsSymtab::add_local(const textchar_t *sym, size_t len,
                                     int local_num, int copy_str,
                                     int init_assigned, int init_referenced)
{
    CTcSymLocal *lcl;

    /* 
     *   make sure the symbol isn't already defined in this scope; if it
     *   is, log an error 
     */
    if (find_direct(sym, len) != 0)
    {
        /* log the error */
        G_tok->log_error(TCERR_LOCAL_REDEF, (int)len, sym);

        /* don't create the symbol again - return the original definition */
        return 0;
    }

    /* create the symbol entry */
    lcl = new CTcSymLocal(sym, len, copy_str, FALSE, local_num);

    /* 
     *   if the symbol is initially to be marked as referenced or
     *   assigned, mark it now 
     */
    if (init_assigned)
        lcl->set_val_assigned(TRUE);
    if (init_referenced)
        lcl->set_val_used(TRUE);
    
    /* add it to the table */
    add_entry(lcl);

    /* return the new local */
    return lcl;
}